

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

uchar encodeRegister(x86XmmReg dst,char spareField)

{
  uint __line;
  char *__assertion;
  
  if ((byte)spareField < 8) {
    if (dst < rXMM8) {
      return (byte)dst | spareField << 3 | 0xc0;
    }
    __assertion = "unsigned(dst) <= 0x7";
    __line = 0x30;
  }
  else {
    __assertion = "unsigned(spareField) <= 0x7";
    __line = 0x2f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                ,__line,"unsigned char encodeRegister(x86XmmReg, char)");
}

Assistant:

unsigned char encodeRegister(x86XmmReg dst, char spareField)
{
	assert(unsigned(spareField) <= 0x7);
	assert(unsigned(dst) <= 0x7);

	unsigned char mod = 3 << 6;
	unsigned char spare = spareField << 3;
	unsigned char RM = (unsigned char)dst;
	return mod | spare | RM;
}